

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

void Expect(istream *input,char c)

{
  char __rhs;
  undefined8 *puVar1;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = std::istream::get();
  if ((int)__rhs == (int)CONCAT71(in_register_00000031,c)) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"unexpected char: expected ","");
  std::operator+(&local_b0,&local_70,c);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90.field_2._M_allocated_capacity._0_4_ = 0x6f67202c;
  local_90.field_2._M_allocated_capacity._4_2_ = 0x2074;
  local_90._M_string_length = 6;
  local_90.field_2._M_local_buf[6] = '\0';
  std::operator+(&local_d0,&local_b0,&local_90);
  std::operator+(&local_50,&local_d0,__rhs);
  *puVar1 = &PTR__ReadException_001258b0;
  puVar1[1] = puVar1 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    *(undefined4 *)(puVar1 + 3) = local_50.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)puVar1 + 0x1c) = local_50.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(puVar1 + 4) = local_50.field_2._8_4_;
    *(undefined4 *)((long)puVar1 + 0x24) = local_50.field_2._12_4_;
  }
  else {
    puVar1[1] = local_50._M_dataplus._M_p;
    puVar1[3] = CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                         local_50.field_2._M_allocated_capacity._0_4_);
  }
  puVar1[2] = local_50._M_string_length;
  local_50._M_string_length = 0;
  local_50.field_2._M_allocated_capacity._0_4_ =
       local_50.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  __cxa_throw(puVar1,&ReadException::typeinfo,ReadException::~ReadException);
}

Assistant:

static void Expect(std::istream &input, char c) {
  char read = (char)input.get();
  if (read != c) {
    throw ReadException("unexpected char: expected "s + c + ", got "s + read);
  }
}